

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_spawn.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_spawn::~xr_level_spawn(xr_level_spawn *this)

{
  ~xr_level_spawn(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

xr_level_spawn::~xr_level_spawn()
{
	delete_elements(m_spawns);
}